

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O3

void print_last_session_error(char *function)

{
  if (connected_session == (LIBSSH2_SESSION *)0x0) {
    print_last_session_error_cold_2();
  }
  else {
    print_last_session_error_cold_1();
  }
  return;
}

Assistant:

void print_last_session_error(const char *function)
{
    if(connected_session) {
        char *message;
        int rc =
            libssh2_session_last_error(connected_session, &message, NULL, 0);
        fprintf(stderr, "%s failed (%d): %s\n", function, rc, message);
    }
    else {
        fprintf(stderr, "No session\n");
    }
}